

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O1

bool __thiscall Scs::Socket::Listen(Socket *this)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  
  iVar2 = listen(this->m_socket,0x1000);
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  if (((iVar2 == -1) && (uVar1 != 0xb)) && (uVar1 != 0x73)) {
    LogWriteLine("Socket listen failed: %d",(ulong)uVar1);
  }
  return (uVar1 == 0x73 || uVar1 == 0xb) || iVar2 != -1;
}

Assistant:

bool Socket::Listen()
{
	// Connect to server.
	int result = listen(m_socket, SOMAXCONN);
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR && lastError != SCS_EWOULDBLOCK && lastError != EAGAIN && lastError != SCS_EINPROGRESS)
	{
		LogWriteLine("Socket listen failed: %d", lastError);
		return false;
	}
	return true;
}